

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O1

void BrotliStoreMetaBlockHeader(size_t len,int is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *storage_ix;
  *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3];
  uVar2 = uVar1 + 1;
  *storage_ix = uVar2;
  uVar3 = 4;
  if (0x10000 < len) {
    uVar3 = 6 - (ulong)(len < 0x100001);
  }
  *(ulong *)(storage + (uVar2 >> 3)) = uVar3 - 4 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  uVar2 = uVar1 + 3;
  *storage_ix = uVar2;
  *(size_t *)(storage + (uVar2 >> 3)) = len - 1 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  uVar2 = uVar1 + (uVar3 & 0xffffffff) * 4 + 3;
  *storage_ix = uVar2;
  *(ulong *)(storage + (uVar2 >> 3)) =
       (ulong)(uint)is_uncompressed << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  *storage_ix = uVar1 + (uVar3 & 0xffffffff) * 4 + 4;
  return;
}

Assistant:

static void BrotliStoreMetaBlockHeader(
    size_t len, BROTLI_BOOL is_uncompressed, size_t* storage_ix,
    uint8_t* storage) {
  size_t nibbles = 6;
  /* ISLAST */
  BrotliWriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    nibbles = 4;
  } else if (len <= (1U << 20)) {
    nibbles = 5;
  }
  BrotliWriteBits(2, nibbles - 4, storage_ix, storage);
  BrotliWriteBits(nibbles * 4, len - 1, storage_ix, storage);
  /* ISUNCOMPRESSED */
  BrotliWriteBits(1, (uint64_t)is_uncompressed, storage_ix, storage);
}